

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ref.h
# Opt level: O0

void __thiscall
Eigen::RefBase<Eigen::Ref<Eigen::Matrix<double,-1,2,1,-1,2>,0,Eigen::OuterStride<-1>>>::
construct<Eigen::Matrix<double,_1,2,1,_1,2>>
          (RefBase<Eigen::Ref<Eigen::Matrix<double,_1,2,1,_1,2>,0,Eigen::OuterStride<_1>>> *this,
          Matrix<double,__1,_2,_1,__1,_2> *expr)

{
  Scalar *dataPtr;
  Index IVar1;
  Index cols;
  Matrix<double,__1,_2,_1,__1,_2> *expr_local;
  RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_2,_1,__1,_2>,_0,_Eigen::OuterStride<_1>_>_>
  *this_local;
  
  dataPtr = PlainObjectBase<Eigen::Matrix<double,_-1,_2,_1,_-1,_2>_>::data
                      (&expr->super_PlainObjectBase<Eigen::Matrix<double,__1,_2,_1,__1,_2>_>);
  IVar1 = PlainObjectBase<Eigen::Matrix<double,_-1,_2,_1,_-1,_2>_>::rows
                    (&expr->super_PlainObjectBase<Eigen::Matrix<double,__1,_2,_1,__1,_2>_>);
  cols = PlainObjectBase<Eigen::Matrix<double,_-1,_2,_1,_-1,_2>_>::cols
                   (&expr->super_PlainObjectBase<Eigen::Matrix<double,__1,_2,_1,__1,_2>_>);
  MapBase<Eigen::Ref<Eigen::Matrix<double,_-1,_2,_1,_-1,_2>,_0,_Eigen::OuterStride<-1>_>,_1>::
  MapBase((MapBase<Eigen::Ref<Eigen::Matrix<double,__1,_2,_1,__1,_2>,_0,_Eigen::OuterStride<_1>_>,_1>
           *)this,dataPtr,IVar1,cols);
  IVar1 = Matrix<double,_-1,_2,_1,_-1,_2>::outerStride(expr);
  Stride<-1,_0>::Stride((Stride<_1,_0> *)(this + 0x18),IVar1,0);
  return;
}

Assistant:

EIGEN_DEVICE_FUNC void construct(Expression& expr)
  {
    EIGEN_STATIC_ASSERT_SAME_MATRIX_SIZE(PlainObjectType,Expression);

    if(PlainObjectType::RowsAtCompileTime==1)
    {
      eigen_assert(expr.rows()==1 || expr.cols()==1);
      ::new (static_cast<Base*>(this)) Base(expr.data(), 1, expr.size());
    }
    else if(PlainObjectType::ColsAtCompileTime==1)
    {
      eigen_assert(expr.rows()==1 || expr.cols()==1);
      ::new (static_cast<Base*>(this)) Base(expr.data(), expr.size(), 1);
    }
    else
      ::new (static_cast<Base*>(this)) Base(expr.data(), expr.rows(), expr.cols());
    
    if(Expression::IsVectorAtCompileTime && (!PlainObjectType::IsVectorAtCompileTime) && ((Expression::Flags&RowMajorBit)!=(PlainObjectType::Flags&RowMajorBit)))
      ::new (&m_stride) StrideBase(expr.innerStride(), StrideType::InnerStrideAtCompileTime==0?0:1);
    else
      ::new (&m_stride) StrideBase(StrideType::OuterStrideAtCompileTime==0?0:expr.outerStride(),
                                   StrideType::InnerStrideAtCompileTime==0?0:expr.innerStride());    
  }